

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O0

pair<int,_int> __thiscall Boards::Count(Boards *this)

{
  reference pvVar1;
  reference pvVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  int w;
  int b;
  Boards *this_local;
  
  i = 0;
  j = 0;
  _w = this;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
      pvVar1 = std::array<std::array<int,_16UL>,_16UL>::operator[](&this->board,(long)local_24);
      pvVar2 = std::array<int,_16UL>::operator[](pvVar1,(long)local_28);
      if (*pvVar2 == 1) {
        j = j + 1;
      }
      else {
        pvVar1 = std::array<std::array<int,_16UL>,_16UL>::operator[](&this->board,(long)local_24);
        pvVar2 = std::array<int,_16UL>::operator[](pvVar1,(long)local_28);
        if (*pvVar2 == -1) {
          i = i + 1;
        }
      }
    }
  }
  std::pair<int,_int>::pair<int_&,_int_&,_true>((pair<int,_int> *)&this_local,&j,&i);
  return (pair<int,_int>)this_local;
}

Assistant:

std::pair<int, int> Boards::Count(){
	int b = 0, w = 0;
	for(int i = 0; i < 16; i++){
		for(int j = 0; j < 16; j++){
			if(board[i][j] == 1)w++;
			else if(board[i][j] == -1)b++;
		}
	}
	return std::pair<int, int>(w, b);
}